

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

int stbi__info_main(stbi__context *s,int *x,int *y,int *comp)

{
  long lVar1;
  int iVar2;
  stbi__gif *g;
  void *pvVar3;
  stbi__png local_58;
  
  g = (stbi__gif *)malloc(0x4888);
  *(stbi__context **)g = s;
  iVar2 = stbi__decode_jpeg_header((stbi__jpeg *)g,2);
  if (iVar2 == 0) {
    lVar1 = *(long *)g;
    *(undefined8 *)(lVar1 + 0xb8) = *(undefined8 *)(lVar1 + 200);
    *(undefined8 *)(lVar1 + 0xc0) = *(undefined8 *)(lVar1 + 0xd0);
    free(g);
    local_58.s = s;
    iVar2 = stbi__png_info_raw(&local_58,x,y,comp);
    if (iVar2 != 0) {
      return 1;
    }
    g = (stbi__gif *)malloc(0x8870);
    iVar2 = stbi__gif_header(s,g,comp,1);
    if (iVar2 == 0) {
      free(g);
      s->img_buffer = s->img_buffer_original;
      s->img_buffer_end = s->img_buffer_original_end;
      local_58.out._4_4_ = 0xff;
      pvVar3 = stbi__bmp_parse_header(s,(stbi__bmp_data *)&local_58);
      s->img_buffer = s->img_buffer_original;
      s->img_buffer_end = s->img_buffer_original_end;
      if (pvVar3 != (void *)0x0) {
        if (x != (int *)0x0) {
          *x = s->img_x;
        }
        if (y != (int *)0x0) {
          *y = s->img_y;
        }
        if (comp == (int *)0x0) {
          return 1;
        }
        *comp = 4 - (uint)((int)local_58.out == 0 ||
                          (int)local_58.out == -0x1000000 && (int)local_58.s == 0x18);
        return 1;
      }
      iVar2 = stbi__psd_info(s,x,y,comp);
      if (iVar2 != 0) {
        return 1;
      }
      iVar2 = stbi__pic_info(s,x,y,comp);
      if (iVar2 == 0) {
        iVar2 = stbi__pnm_info(s,x,y,comp);
        if (iVar2 != 0) {
          return 1;
        }
        iVar2 = stbi__hdr_info(s,x,y,comp);
        if (iVar2 == 0) {
          iVar2 = stbi__tga_info(s,x,y,comp);
          if (iVar2 == 0) {
            stbi__g_failure_reason = "unknown image type";
            return 0;
          }
          return 1;
        }
        return 1;
      }
      return 1;
    }
    if (x != (int *)0x0) {
      *x = g->w;
    }
    if (y != (int *)0x0) {
      *y = g->h;
    }
  }
  else {
    if (x != (int *)0x0) {
      *x = **(int **)g;
    }
    if (y != (int *)0x0) {
      *y = *(int *)(*(long *)g + 4);
    }
    if (comp != (int *)0x0) {
      *comp = (uint)(2 < *(int *)(*(long *)g + 8)) * 2 + 1;
    }
  }
  free(g);
  return 1;
}

Assistant:

static int stbi__info_main(stbi__context *s, int *x, int *y, int *comp)
{
   #ifndef STBI_NO_JPEG
   if (stbi__jpeg_info(s, x, y, comp)) return 1;
   #endif

   #ifndef STBI_NO_PNG
   if (stbi__png_info(s, x, y, comp))  return 1;
   #endif

   #ifndef STBI_NO_GIF
   if (stbi__gif_info(s, x, y, comp))  return 1;
   #endif

   #ifndef STBI_NO_BMP
   if (stbi__bmp_info(s, x, y, comp))  return 1;
   #endif

   #ifndef STBI_NO_PSD
   if (stbi__psd_info(s, x, y, comp))  return 1;
   #endif

   #ifndef STBI_NO_PIC
   if (stbi__pic_info(s, x, y, comp))  return 1;
   #endif

   #ifndef STBI_NO_PNM
   if (stbi__pnm_info(s, x, y, comp))  return 1;
   #endif

   #ifndef STBI_NO_HDR
   if (stbi__hdr_info(s, x, y, comp))  return 1;
   #endif

   // test tga last because it's a crappy test!
   #ifndef STBI_NO_TGA
   if (stbi__tga_info(s, x, y, comp))
       return 1;
   #endif
   return stbi__err("unknown image type", "Image not of any known type, or corrupt");
}